

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.h
# Opt level: O2

void __thiscall wasm::TypeUpdater::noteRecursiveRemoval(TypeUpdater *this,Expression *curr)

{
  undefined1 local_e8 [176];
  _Vector_base<wasm::Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::Task,_std::allocator<wasm::Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::Task>_>
  local_38 [2];
  
  noteRecursiveRemoval(wasm::Expression*)::Recurser::Recurser(wasm::TypeUpdater&,wasm::Expression__
            (local_e8,this,curr);
  std::
  _Vector_base<wasm::Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::Task,_std::allocator<wasm::Walker<Recurser,_wasm::UnifiedExpressionVisitor<Recurser,_void>_>::Task>_>
  ::~_Vector_base(local_38);
  return;
}

Assistant:

void noteRecursiveRemoval(Expression* curr) {
    struct Recurser
      : public PostWalker<Recurser, UnifiedExpressionVisitor<Recurser>> {
      TypeUpdater& parent;

      Recurser(TypeUpdater& parent, Expression* root) : parent(parent) {
        walk(root);
      }

      void visitExpression(Expression* curr) { parent.noteRemoval(curr); }
    };

    Recurser(*this, curr);
  }